

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::relocate
          (QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *this,qsizetype offset,
          QFlags<Qt::AlignmentFlag> **data)

{
  QFlags<Qt::AlignmentFlag> *d_first;
  QFlags<Qt::AlignmentFlag> *pQVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QFlags<Qt::AlignmentFlag>,long_long>(this->ptr,this->size,d_first)
  ;
  if (data != (QFlags<Qt::AlignmentFlag> **)0x0) {
    pQVar1 = *data;
    if ((this->ptr <= pQVar1) && (pQVar1 < this->ptr + this->size)) {
      *data = pQVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }